

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O2

int uv_inet_ntop(int af,void *src,char *dst,size_t size)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  char *dst_00;
  ulong uVar11;
  uint local_88 [8];
  char tmp [46];
  undefined1 auStack_3a [10];
  
  if (af == 10) {
    local_88[4] = 0;
    local_88[5] = 0;
    local_88[6] = 0;
    local_88[7] = 0;
    local_88[0] = 0;
    local_88[1] = 0;
    local_88[2] = 0;
    local_88[3] = 0;
    bVar1 = 0;
    for (uVar8 = 0; uVar8 != 0x10; uVar8 = uVar8 + 1) {
      local_88[uVar8 >> 1 & 0x7fffffff] =
           local_88[uVar8 >> 1 & 0x7fffffff] | (uint)*(byte *)((long)src + uVar8) << (~bVar1 & 8);
      bVar1 = bVar1 + 8;
    }
    uVar10 = 0;
    iVar2 = 0;
    uVar8 = 0xffffffff;
    iVar7 = 0;
    uVar11 = 0xffffffff;
    while( true ) {
      uVar9 = (uint)uVar11;
      uVar3 = (uint)uVar8;
      if (uVar10 == 8) break;
      if (local_88[uVar10] == 0) {
        iVar7 = iVar7 + 1;
        if (uVar9 == 0xffffffff) {
          iVar7 = 1;
          uVar11 = uVar10 & 0xffffffff;
        }
      }
      else {
        uVar5 = uVar8;
        iVar4 = iVar2;
        if ((uVar9 != 0xffffffff) &&
           (uVar5 = uVar11, iVar4 = iVar7, iVar7 <= iVar2 && uVar3 != 0xffffffff)) {
          uVar5 = uVar8;
          iVar4 = iVar2;
        }
        uVar11 = 0xffffffff;
        uVar8 = uVar5;
        iVar2 = iVar4;
      }
      uVar10 = uVar10 + 1;
    }
    if ((uVar9 != 0xffffffff) && (iVar2 < iVar7 || uVar3 == 0xffffffff)) {
      uVar3 = uVar9;
      iVar2 = iVar7;
    }
    uVar8 = 0xffffffff;
    if (1 < iVar2) {
      uVar8 = (ulong)uVar3;
    }
    if (uVar3 == 0xffffffff) {
      uVar8 = 0xffffffff;
    }
    iVar7 = (int)uVar8;
    dst_00 = tmp;
    for (uVar11 = 0; uVar11 != 8; uVar11 = uVar11 + 1) {
      if (((iVar7 == -1) || ((long)uVar11 < (long)iVar7)) || ((long)(iVar7 + iVar2) <= (long)uVar11)
         ) {
        if (uVar11 != 0) {
          *dst_00 = ':';
          dst_00 = dst_00 + 1;
          if ((uVar11 == 6 && uVar8 == 0) &&
             (((iVar2 == 6 || ((iVar2 == 7 && (local_88[7] != 1)))) ||
              ((iVar2 == 5 && (local_88[5] == 0xffff)))))) {
            iVar4 = inet_ntop4((uchar *)((long)src + 0xc),dst_00,
                               (size_t)(auStack_3a + -(long)dst_00));
            if (iVar4 != 0) {
              return iVar4;
            }
            sVar6 = strlen(dst_00);
            dst_00 = dst_00 + sVar6;
            break;
          }
        }
        iVar4 = sprintf(dst_00,"%x",(ulong)local_88[uVar11]);
        dst_00 = dst_00 + iVar4;
      }
      else if (uVar8 == uVar11) {
        *dst_00 = ':';
        dst_00 = dst_00 + 1;
      }
    }
    if ((iVar7 != -1) && (iVar7 + iVar2 == 8)) {
      *dst_00 = ':';
      dst_00 = dst_00 + 1;
    }
    *dst_00 = '\0';
    if (size < dst_00 + (1 - (long)tmp)) {
      iVar2 = -0x1c;
    }
    else {
      uv__strscpy(dst,tmp,size);
      iVar2 = 0;
    }
  }
  else {
    if (af == 2) {
      iVar2 = inet_ntop4((uchar *)src,dst,size);
      return iVar2;
    }
    iVar2 = -0x61;
  }
  return iVar2;
}

Assistant:

int uv_inet_ntop(int af, const void* src, char* dst, size_t size) {
  switch (af) {
  case AF_INET:
    return (inet_ntop4(src, dst, size));
  case AF_INET6:
    return (inet_ntop6(src, dst, size));
  default:
    return UV_EAFNOSUPPORT;
  }
  /* NOTREACHED */
}